

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::finish(ldf *data)

{
  LabelDict::free_label_features(&data->label_features);
  v_array<ACTION_SCORE::action_score>::delete_v((v_array<ACTION_SCORE::action_score> *)data);
  v_array<v_array<ACTION_SCORE::action_score>_>::delete_v
            ((v_array<v_array<ACTION_SCORE::action_score>_> *)data);
  return;
}

Assistant:

void finish(ldf& data)
{
  LabelDict::free_label_features(data.label_features);
  data.a_s.delete_v();
  data.stored_preds.delete_v();
}